

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

Boxed_Number __thiscall chaiscript::Boxed_Number::get_as(Boxed_Number *this,Type_Info *inp_)

{
  bool bVar1;
  char cVar2;
  uchar t;
  char16_t t_00;
  short t_01;
  unsigned_short t_02;
  int t_03;
  wchar_t t_04;
  char32_t t_05;
  uint t_06;
  long t_07;
  longlong t_08;
  unsigned_long t_09;
  unsigned_long_long t_10;
  undefined8 *puVar3;
  Type_Info *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  Type_Info *ti;
  longdouble in_ST0;
  float t_11;
  double t_12;
  Boxed_Number BVar5;
  Type_Info local_48;
  
  local_48.m_type_info = (type_info *)&int::typeinfo;
  local_48.m_bare_type_info = (type_info *)&int::typeinfo;
  local_48.m_flags = 0x10;
  bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
  if (bVar1) {
LAB_002c12e9:
    t_03 = get_as<int>((Boxed_Number *)inp_);
    Boxed_Number<int>(this,t_03);
    _Var4._M_pi = extraout_RDX;
    goto LAB_002c168e;
  }
  local_48.m_type_info = (type_info *)&double::typeinfo;
  local_48.m_bare_type_info = (type_info *)&double::typeinfo;
  local_48.m_flags = 0x10;
  bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
  if (bVar1) {
    t_12 = get_as<double>((Boxed_Number *)inp_);
    Boxed_Number<double>(this,t_12);
    _Var4._M_pi = extraout_RDX_00;
    goto LAB_002c168e;
  }
  local_48.m_type_info = (type_info *)&float::typeinfo;
  local_48.m_bare_type_info = (type_info *)&float::typeinfo;
  local_48.m_flags = 0x10;
  bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
  if (bVar1) {
    t_11 = get_as<float>((Boxed_Number *)inp_);
    Boxed_Number<float>(this,t_11);
    _Var4._M_pi = extraout_RDX_01;
    goto LAB_002c168e;
  }
  ti = &local_48;
  local_48.m_type_info = (type_info *)&long_double::typeinfo;
  local_48.m_bare_type_info = (type_info *)&long_double::typeinfo;
  local_48.m_flags = 0x10;
  bVar1 = Type_Info::bare_equal(in_RDX,ti);
  if (bVar1) {
    get_as<long_double>((longdouble *)inp_,(Boxed_Number *)ti);
    Boxed_Number<long_double>(this,in_ST0);
    _Var4._M_pi = extraout_RDX_02;
    goto LAB_002c168e;
  }
  local_48.m_type_info = (type_info *)&char::typeinfo;
  local_48.m_bare_type_info = (type_info *)&char::typeinfo;
  local_48.m_flags = 0x10;
  bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
  if (bVar1) {
    cVar2 = get_as<char>((Boxed_Number *)inp_);
    Boxed_Number<char>(this,cVar2);
    _Var4._M_pi = extraout_RDX_03;
    goto LAB_002c168e;
  }
  local_48.m_type_info = (type_info *)&unsigned_char::typeinfo;
  local_48.m_bare_type_info = (type_info *)&unsigned_char::typeinfo;
  local_48.m_flags = 0x10;
  bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
  if (bVar1) {
LAB_002c1418:
    t = get_as<unsigned_char>((Boxed_Number *)inp_);
    Boxed_Number<unsigned_char>(this,t);
    _Var4._M_pi = extraout_RDX_04;
    goto LAB_002c168e;
  }
  local_48.m_type_info = (type_info *)&wchar_t::typeinfo;
  local_48.m_bare_type_info = (type_info *)&wchar_t::typeinfo;
  local_48.m_flags = 0x10;
  bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
  if (bVar1) {
    t_04 = get_as<wchar_t>((Boxed_Number *)inp_);
    Boxed_Number<wchar_t>(this,t_04);
    _Var4._M_pi = extraout_RDX_05;
    goto LAB_002c168e;
  }
  local_48.m_type_info = (type_info *)&char16_t::typeinfo;
  local_48.m_bare_type_info = (type_info *)&char16_t::typeinfo;
  local_48.m_flags = 0x10;
  bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
  if (bVar1) {
    t_00 = get_as<char16_t>((Boxed_Number *)inp_);
    Boxed_Number<char16_t>(this,t_00);
    _Var4._M_pi = extraout_RDX_06;
    goto LAB_002c168e;
  }
  local_48.m_type_info = (type_info *)&char32_t::typeinfo;
  local_48.m_bare_type_info = (type_info *)&char32_t::typeinfo;
  local_48.m_flags = 0x10;
  bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
  if (bVar1) {
    t_05 = get_as<char32_t>((Boxed_Number *)inp_);
    Boxed_Number<char32_t>(this,t_05);
    _Var4._M_pi = extraout_RDX_07;
    goto LAB_002c168e;
  }
  local_48.m_type_info = (type_info *)&unsigned_int::typeinfo;
  local_48.m_bare_type_info = (type_info *)&unsigned_int::typeinfo;
  local_48.m_flags = 0x10;
  bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
  if (bVar1) {
LAB_002c150e:
    t_06 = get_as<unsigned_int>((Boxed_Number *)inp_);
    Boxed_Number<unsigned_int>(this,t_06);
    _Var4._M_pi = extraout_RDX_08;
    goto LAB_002c168e;
  }
  local_48.m_type_info = (type_info *)&long::typeinfo;
  local_48.m_bare_type_info = (type_info *)&long::typeinfo;
  local_48.m_flags = 0x10;
  bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
  if (bVar1) {
LAB_002c154b:
    t_07 = get_as<long>((Boxed_Number *)inp_);
    Boxed_Number<long>(this,t_07);
    _Var4._M_pi = extraout_RDX_09;
  }
  else {
    local_48.m_type_info = (type_info *)&long_long::typeinfo;
    local_48.m_bare_type_info = (type_info *)&long_long::typeinfo;
    local_48.m_flags = 0x10;
    bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
    if (bVar1) {
      t_08 = get_as<long_long>((Boxed_Number *)inp_);
      Boxed_Number<long_long>(this,t_08);
      _Var4._M_pi = extraout_RDX_10;
      goto LAB_002c168e;
    }
    local_48.m_type_info = (type_info *)&unsigned_long::typeinfo;
    local_48.m_bare_type_info = (type_info *)&unsigned_long::typeinfo;
    local_48.m_flags = 0x10;
    bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
    if (!bVar1) {
      local_48.m_type_info = (type_info *)&unsigned_long_long::typeinfo;
      local_48.m_bare_type_info = (type_info *)&unsigned_long_long::typeinfo;
      local_48.m_flags = 0x10;
      bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
      if (bVar1) {
        t_10 = get_as<unsigned_long_long>((Boxed_Number *)inp_);
        Boxed_Number<unsigned_long_long>(this,t_10);
        _Var4._M_pi = extraout_RDX_12;
        goto LAB_002c168e;
      }
      local_48.m_type_info = (type_info *)&signed_char::typeinfo;
      local_48.m_bare_type_info = (type_info *)&signed_char::typeinfo;
      local_48.m_flags = 0x10;
      bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
      if (bVar1) {
        cVar2 = get_as<signed_char>((Boxed_Number *)inp_);
        Boxed_Number<signed_char>(this,cVar2);
        _Var4._M_pi = extraout_RDX_13;
        goto LAB_002c168e;
      }
      local_48.m_type_info = (type_info *)&short::typeinfo;
      local_48.m_bare_type_info = (type_info *)&short::typeinfo;
      local_48.m_flags = 0x10;
      bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
      if (bVar1) {
        t_01 = get_as<short>((Boxed_Number *)inp_);
        Boxed_Number<short>(this,t_01);
        _Var4._M_pi = extraout_RDX_14;
        goto LAB_002c168e;
      }
      local_48.m_type_info = (type_info *)&int::typeinfo;
      local_48.m_bare_type_info = (type_info *)&int::typeinfo;
      local_48.m_flags = 0x10;
      bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
      if (bVar1) goto LAB_002c12e9;
      local_48.m_type_info = (type_info *)&long::typeinfo;
      local_48.m_bare_type_info = (type_info *)&long::typeinfo;
      local_48.m_flags = 0x10;
      bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
      if (bVar1) goto LAB_002c154b;
      local_48.m_type_info = (type_info *)&unsigned_char::typeinfo;
      local_48.m_bare_type_info = (type_info *)&unsigned_char::typeinfo;
      local_48.m_flags = 0x10;
      bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
      if (bVar1) goto LAB_002c1418;
      local_48.m_type_info = (type_info *)&unsigned_short::typeinfo;
      local_48.m_bare_type_info = (type_info *)&unsigned_short::typeinfo;
      local_48.m_flags = 0x10;
      bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
      if (bVar1) {
        t_02 = get_as<unsigned_short>((Boxed_Number *)inp_);
        Boxed_Number<unsigned_short>(this,t_02);
        _Var4._M_pi = extraout_RDX_15;
        goto LAB_002c168e;
      }
      local_48.m_type_info = (type_info *)&unsigned_int::typeinfo;
      local_48.m_bare_type_info = (type_info *)&unsigned_int::typeinfo;
      local_48.m_flags = 0x10;
      bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
      if (bVar1) goto LAB_002c150e;
      local_48.m_type_info = (type_info *)&unsigned_long::typeinfo;
      local_48.m_bare_type_info = (type_info *)&unsigned_long::typeinfo;
      local_48.m_flags = 0x10;
      bVar1 = Type_Info::bare_equal(in_RDX,&local_48);
      if (!bVar1) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = &PTR__bad_cast_00321520;
        __cxa_throw(puVar3,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
    }
    t_09 = get_as<unsigned_long>((Boxed_Number *)inp_);
    Boxed_Number<unsigned_long>(this,t_09);
    _Var4._M_pi = extraout_RDX_11;
  }
LAB_002c168e:
  BVar5.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  BVar5.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Boxed_Number)
         BVar5.bv.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Number get_as(const Type_Info &inp_) const {
      if (inp_.bare_equal(user_type<int>())) {
        return Boxed_Number(get_as<int>());
      } else if (inp_.bare_equal(user_type<double>())) {
        return Boxed_Number(get_as<double>());
      } else if (inp_.bare_equal(user_type<float>())) {
        return Boxed_Number(get_as<float>());
      } else if (inp_.bare_equal(user_type<long double>())) {
        return Boxed_Number(get_as<long double>());
      } else if (inp_.bare_equal(user_type<char>())) {
        return Boxed_Number(get_as<char>());
      } else if (inp_.bare_equal(user_type<unsigned char>())) {
        return Boxed_Number(get_as<unsigned char>());
      } else if (inp_.bare_equal(user_type<wchar_t>())) {
        return Boxed_Number(get_as<wchar_t>());
      } else if (inp_.bare_equal(user_type<char16_t>())) {
        return Boxed_Number(get_as<char16_t>());
      } else if (inp_.bare_equal(user_type<char32_t>())) {
        return Boxed_Number(get_as<char32_t>());
      } else if (inp_.bare_equal(user_type<unsigned int>())) {
        return Boxed_Number(get_as<unsigned int>());
      } else if (inp_.bare_equal(user_type<long>())) {
        return Boxed_Number(get_as<long>());
      } else if (inp_.bare_equal(user_type<long long>())) {
        return Boxed_Number(get_as<long long>());
      } else if (inp_.bare_equal(user_type<unsigned long>())) {
        return Boxed_Number(get_as<unsigned long>());
      } else if (inp_.bare_equal(user_type<unsigned long long>())) {
        return Boxed_Number(get_as<unsigned long long>());
      } else if (inp_.bare_equal(user_type<int8_t>())) {
        return Boxed_Number(get_as<int8_t>());
      } else if (inp_.bare_equal(user_type<int16_t>())) {
        return Boxed_Number(get_as<int16_t>());
      } else if (inp_.bare_equal(user_type<int32_t>())) {
        return Boxed_Number(get_as<int32_t>());
      } else if (inp_.bare_equal(user_type<int64_t>())) {
        return Boxed_Number(get_as<int64_t>());
      } else if (inp_.bare_equal(user_type<uint8_t>())) {
        return Boxed_Number(get_as<uint8_t>());
      } else if (inp_.bare_equal(user_type<uint16_t>())) {
        return Boxed_Number(get_as<uint16_t>());
      } else if (inp_.bare_equal(user_type<uint32_t>())) {
        return Boxed_Number(get_as<uint32_t>());
      } else if (inp_.bare_equal(user_type<uint64_t>())) {
        return Boxed_Number(get_as<uint64_t>());
      } else {
        throw chaiscript::detail::exception::bad_any_cast();
      }
    }